

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,endpoint *param_1,address *ip,ip_source_t source_type,address *source)

{
  pointer psVar1;
  bool bVar2;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  long lVar3;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  sock;
  long lVar4;
  
  __it._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)__it._M_current;
  if (0 < lVar3 >> 6) {
    lVar4 = (lVar3 >> 6) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                            *)param_1,__it);
      sock._M_current = __it._M_current;
      if (bVar2) goto LAB_002cde52;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                            *)param_1,__it._M_current + 1);
      sock._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_002cde52;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                            *)param_1,__it._M_current + 2);
      sock._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_002cde52;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                            *)param_1,__it._M_current + 3);
      sock._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_002cde52;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x40;
    } while (1 < lVar4);
  }
  lVar3 = lVar3 >> 4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      sock._M_current = psVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
                  ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                                *)param_1,__it), sock._M_current = __it._M_current, bVar2))
      goto LAB_002cde52;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)param_1,__it);
    sock._M_current = __it._M_current;
    if (bVar2) goto LAB_002cde52;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
          ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                        *)param_1,__it);
  sock._M_current = psVar1;
  if (bVar2) {
    sock._M_current = __it._M_current;
  }
LAB_002cde52:
  if (sock._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  set_external_address(this,sock._M_current,ip,source_type,source);
  return;
}

Assistant:

void session_impl::set_external_address(
		tcp::endpoint const& local_endpoint, address const& ip
		, ip_source_t const source_type, address const& source)
	{
		auto sock = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& v)
			{ return v->local_endpoint.address() == local_endpoint.address(); });

		if (sock != m_listen_sockets.end())
			set_external_address(*sock, ip, source_type, source);
	}